

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int ffmkey(fitsfile *fptr,char *card,int *status)

{
  ulong uVar1;
  __int32_t **pp_Var2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  char tcard [81];
  
  if (fptr->HDUposition != fptr->Fptr->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  strncpy(tcard,card,0x50);
  tcard[0x50] = '\0';
  uVar1 = strlen(tcard);
  for (sVar3 = 0; uVar1 != sVar3; sVar3 = sVar3 + 1) {
    if ((byte)(tcard[sVar3] + 0x81U) < 0xa1) {
      tcard[sVar3] = ' ';
    }
  }
  for (; uVar1 < 0x50; uVar1 = uVar1 + 1) {
    tcard[uVar1] = ' ';
  }
  sVar3 = strcspn(tcard,"=");
  lVar5 = 8;
  if ((int)sVar3 != 0x50) {
    lVar5 = (long)(int)sVar3;
  }
  for (lVar4 = 0; lVar5 != lVar4; lVar4 = lVar4 + 1) {
    pp_Var2 = __ctype_toupper_loc();
    tcard[lVar4] = (char)(*pp_Var2)[tcard[lVar4]];
  }
  fftkey(tcard,status);
  ffmbyt(fptr,fptr->Fptr->nextkey + -0x50,0,status);
  ffpbyt(fptr,0x50,tcard,status);
  return *status;
}

Assistant:

int ffmkey(fitsfile *fptr,    /* I - FITS file pointer  */
           const char *card,  /* I - card string value  */
           int *status)       /* IO - error status      */
/*
  replace the previously read card (i.e. starting 80 bytes before the
  (fptr->Fptr)->nextkey position) with the contents of the input card.
*/
{
    char tcard[81];
    size_t len, ii;
    int keylength = 8;

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    strncpy(tcard,card,80);
    tcard[80] = '\0';

    len = strlen(tcard);

    /* silently replace any illegal characters with a space */
    for (ii=0; ii < len; ii++)  
        if (tcard[ii] < ' ' || tcard[ii] > 126) tcard[ii] = ' ';

    for (ii=len; ii < 80; ii++)    /* fill card with spaces if necessary */
        tcard[ii] = ' ';

    keylength = strcspn(tcard, "=");
    if (keylength == 80) keylength = 8;

    for (ii=0; ii < keylength; ii++)       /* make sure keyword name is uppercase */
        tcard[ii] = toupper(tcard[ii]);

    fftkey(tcard, status);        /* test keyword name contains legal chars */

/*  no need to do this any more, since any illegal characters have been removed
    fftrec(tcard, status);   */     /* test rest of keyword for legal chars   */

    /* move position of keyword to be over written */
    ffmbyt(fptr, ((fptr->Fptr)->nextkey) - 80, REPORT_EOF, status); 
    ffpbyt(fptr, 80, tcard, status);   /* write the 80 byte card */

    return(*status);
}